

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::writePMT(TSMuxer *this)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  TSPacket *tsPacket;
  uint8_t *puStack_18;
  int i;
  uint8_t *curPos;
  TSMuxer *this_local;
  
  puStack_18 = this->m_pmtBuffer;
  for (tsPacket._4_4_ = 0; (long)tsPacket._4_4_ < this->m_pmtFrames;
      tsPacket._4_4_ = tsPacket._4_4_ + 1) {
    if ((this->m_m2tsMode & 1U) != 0) {
      this->m_outBufLen = this->m_outBufLen + 4;
      this->m_processedBlockSize = this->m_processedBlockSize + 4;
      this->m_pcrBits = this->m_pcrBits + 0x20;
    }
    memcpy(this->m_outBuf + this->m_outBufLen,puStack_18,0xbc);
    uVar1 = this->m_pmtCnt;
    this->m_pmtCnt = uVar1 + 1;
    *(uint *)(this->m_outBuf + this->m_outBufLen) =
         *(uint *)(this->m_outBuf + this->m_outBufLen) & 0xf0ffffff | (uVar1 & 0xf) << 0x18;
    this->m_outBufLen = this->m_outBufLen + 0xbc;
    this->m_processedBlockSize = this->m_processedBlockSize + 0xbc;
    this->m_pcrBits = this->m_pcrBits + 0x5e0;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_muxedPacketCnt);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_muxedPacketCnt,sVar2 - 1);
    *pvVar3 = *pvVar3 + 1;
    writeOutBuffer(this);
    puStack_18 = puStack_18 + 0xbc;
  }
  return;
}

Assistant:

void TSMuxer::writePMT()
{
    const uint8_t* curPos = m_pmtBuffer;
    for (int i = 0; i < m_pmtFrames; i++)
    {
        if (m_m2tsMode)
        {
            m_outBufLen += 4;
            m_processedBlockSize += 4;
            m_pcrBits += 4 * 8;
        }
        memcpy(m_outBuf + m_outBufLen, curPos, TS_FRAME_SIZE);
        const auto tsPacket = reinterpret_cast<TSPacket*>(m_outBuf + m_outBufLen);
        tsPacket->counter = m_pmtCnt++;
        m_outBufLen += TS_FRAME_SIZE;
        m_processedBlockSize += TS_FRAME_SIZE;
        m_pcrBits += TS_FRAME_SIZE * 8;
        m_muxedPacketCnt[m_muxedPacketCnt.size() - 1]++;
        writeOutBuffer();
        curPos += TS_FRAME_SIZE;
    }
}